

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzstrmatrixor.cpp
# Opt level: O3

void __thiscall
TPZStructMatrixOR<double>::MultiThread_Assemble
          (TPZStructMatrixOR<double> *this,TPZBaseMatrix *mat,TPZBaseMatrix *rhs,
          TPZAutoPointer<TPZGuiInterface> *guiInterface)

{
  uint uVar1;
  TPZGuiInterface *this_00;
  bool bVar2;
  TPZStructMatrix *strmat;
  uint uVar3;
  long lVar4;
  vector<std::thread,_std::allocator<std::thread>_> allthreads;
  ThreadData threaddata;
  thread local_178;
  TPZAutoPointer<TPZGuiInterface> local_170;
  vector<std::thread,_std::allocator<std::thread>_> local_168;
  ThreadData *local_150;
  ThreadData local_148;
  
  strmat = (TPZStructMatrix *)
           __dynamic_cast(this,&typeinfo,&TPZStructMatrix::typeinfo,0xfffffffffffffffe);
  if (strmat == (TPZStructMatrix *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "virtual void TPZStructMatrixOR<double>::MultiThread_Assemble(TPZBaseMatrix &, TPZBaseMatrix &, TPZAutoPointer<TPZGuiInterface>) [TVar = double]"
               ,0x8f);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Run-time error.Aborting...\n",0x1b);
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/StrMatrix/pzstrmatrixor.cpp"
               ,0x1e3);
  }
  local_170 = (TPZAutoPointer<TPZGuiInterface>)guiInterface->fRef;
  LOCK();
  ((local_170.fRef)->fCounter).super___atomic_base<int>._M_i =
       ((local_170.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
  UNLOCK();
  ThreadData::ThreadData
            (&local_148,strmat,mat,rhs,&strmat->fMaterialIds,&local_170,
             (bool)(&this->field_0xc)[*(long *)(*(long *)this + -0x60)]);
  TPZAutoPointer<TPZGuiInterface>::~TPZAutoPointer(&local_170);
  uVar1 = *(uint *)(&this->field_0x8 + *(long *)(*(long *)this + -0x60));
  local_168.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((guiInterface->fRef != (TPZReference *)0x0) &&
     (this_00 = guiInterface->fRef->fPointer, this_00 != (TPZGuiInterface *)0x0)) {
    bVar2 = TPZGuiInterface::AmIKilled(this_00);
    if (bVar2) goto LAB_0133c783;
  }
  if (0 < (int)uVar1) {
    uVar3 = uVar1;
    do {
      local_150 = &local_148;
      std::thread::thread<void*(&)(void*),TPZStructMatrixOR<double>::ThreadData*,void>
                (&local_178,ThreadData::ThreadWork,&local_150);
      std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
                (&local_168,&local_178);
      if (local_178._M_id._M_thread != 0) {
        std::terminate();
      }
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  ThreadData::ThreadAssembly(&local_148);
  if (0 < (int)uVar1) {
    lVar4 = 0;
    do {
      std::thread::join();
      lVar4 = lVar4 + 8;
    } while ((ulong)uVar1 << 3 != lVar4);
  }
LAB_0133c783:
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&local_168);
  ThreadData::~ThreadData(&local_148);
  return;
}

Assistant:

void
TPZStructMatrixOR<TVar>::MultiThread_Assemble(TPZBaseMatrix & mat, TPZBaseMatrix & rhs, TPZAutoPointer<TPZGuiInterface> guiInterface) {
    auto *myself = dynamic_cast<TPZStructMatrix*>(this);
    if(!myself){
        PZError<<__PRETTY_FUNCTION__;
        PZError<<"Run-time error.Aborting...\n";
        DebugStop();
    }
    ThreadData threaddata(myself,mat,rhs,myself->MaterialIds(),guiInterface,ComputeRhs());
    const int numthreads = this->fNumThreads;
    std::vector<std::thread> allthreads;
    int itr;
    if (guiInterface) {
        if (guiInterface->AmIKilled()) {
            return;
        }
    }
    for (itr = 0; itr < numthreads; itr++) {
      allthreads.push_back(std::thread(ThreadData::ThreadWork, &threaddata));
    }

    ThreadData::ThreadAssembly(&threaddata);

    for (itr = 0; itr < numthreads; itr++) {
      allthreads[itr].join();
    }

#ifdef PZ_LOG2
    if (loggerCheck.isDebugEnabled()) {
        std::stringstream sout;
        //stiffness.Print("Matriz de Rigidez: ",sout);
        mat.Print("Matriz de Rigidez: ", sout, EMathematicaInput);
        rhs.Print("Right Handside", sout, EMathematicaInput);
        LOGPZ_DEBUG(loggerCheck, sout.str())
    }
#endif
}